

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

DWORD64 CONTEXTGetPC(LPCONTEXT pContext)

{
  LPCONTEXT pContext_local;
  
  return pContext->Rip;
}

Assistant:

inline static DWORD64 CONTEXTGetPC(LPCONTEXT pContext)
{
#if defined(_AMD64_)
    return pContext->Rip;
#elif defined(__i686__)
    return pContext->Eip;
#elif defined(_ARM64_) || defined(_ARM_)
    return pContext->Pc;
#else
#error don't know how to get the program counter for this architecture
#endif
}